

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::IsLinkLookupScope(cmGeneratorTarget *this,string *n,cmLocalGenerator **lg)

{
  bool bVar1;
  int iVar2;
  cmLocalGenerator *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmDirectoryId dirId;
  cmDirectoryId local_60;
  string local_40;
  
  local_60.String._M_string_length = (size_type)(n->_M_dataplus)._M_p;
  local_60.String._M_dataplus._M_p = (pointer)n->_M_string_length;
  __str._M_str = "::@";
  __str._M_len = 3;
  iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,0,3,__str);
  if (iVar2 != 0) {
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)n);
  cmDirectoryId::cmDirectoryId(&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_60.String._M_string_length == (pointer)0x0) {
    pcVar3 = this->LocalGenerator;
  }
  else {
    pcVar3 = cmGlobalGenerator::FindLocalGenerator(this->GlobalGenerator,&local_60);
    if (pcVar3 == (cmLocalGenerator *)0x0) {
      bVar1 = true;
      goto LAB_003657a1;
    }
  }
  *lg = pcVar3;
  bVar1 = false;
LAB_003657a1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.String._M_dataplus._M_p != &local_60.String.field_2) {
    operator_delete(local_60.String._M_dataplus._M_p,
                    local_60.String.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::IsLinkLookupScope(std::string const& n,
                                          cmLocalGenerator const*& lg) const
{
  if (cmHasLiteralPrefix(n, CMAKE_DIRECTORY_ID_SEP)) {
    cmDirectoryId const dirId = n.substr(sizeof(CMAKE_DIRECTORY_ID_SEP) - 1);
    if (dirId.String.empty()) {
      lg = this->LocalGenerator;
      return true;
    }
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      return true;
    }
  }
  return false;
}